

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugPubTable.cpp
# Opt level: O3

void __thiscall
llvm::DWARFDebugPubTable::DWARFDebugPubTable
          (DWARFDebugPubTable *this,DWARFObject *Obj,DWARFSection *Sec,bool LittleEndian,
          bool GnuStyle)

{
  pointer *ppEVar1;
  pointer pSVar2;
  iterator __position;
  byte bVar3;
  uint16_t uVar4;
  uint32_t uVar5;
  uint64_t uVar6;
  undefined7 in_register_00000081;
  ulong uVar7;
  undefined1 local_b0 [8];
  DWARFDataExtractor PubNames;
  undefined1 local_80 [16];
  StringRef local_70;
  pointer pEStack_60;
  pointer local_58;
  DWARFSection *local_50;
  undefined4 local_44;
  DWARFDebugPubTable *local_40;
  char *local_38;
  uint64_t Offset;
  
  (this->Sets).
  super__Vector_base<llvm::DWARFDebugPubTable::Set,_std::allocator<llvm::DWARFDebugPubTable::Set>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Sets).
  super__Vector_base<llvm::DWARFDebugPubTable::Set,_std::allocator<llvm::DWARFDebugPubTable::Set>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Sets).
  super__Vector_base<llvm::DWARFDebugPubTable::Set,_std::allocator<llvm::DWARFDebugPubTable::Set>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_44 = (undefined4)CONCAT71(in_register_00000081,GnuStyle);
  this->GnuStyle = GnuStyle;
  local_b0 = (undefined1  [8])(Sec->Data).Data;
  PubNames.super_DataExtractor.Data.Data = (char *)(Sec->Data).Length;
  PubNames.super_DataExtractor.Data.Length._1_1_ = 0;
  local_38 = (char *)0x0;
  if (PubNames.super_DataExtractor.Data.Data != (char *)0x0) {
    PubNames.super_DataExtractor.Data.Length._0_1_ = LittleEndian;
    PubNames.super_DataExtractor._16_8_ = Obj;
    PubNames.Obj = (DWARFObject *)Sec;
    local_50 = Sec;
    local_40 = this;
    do {
      local_80._0_8_ = local_80._0_8_ & 0xffff000000000000;
      local_80._8_4_ = GIEK_NONE;
      local_80._12_4_ = GIEL_EXTERNAL;
      local_70.Data = (char *)(local_70._4_8_ << 0x20);
      local_58 = (pointer)0x0;
      local_70.Length = 0;
      pEStack_60 = (pointer)0x0;
      std::vector<llvm::DWARFDebugPubTable::Set,_std::allocator<llvm::DWARFDebugPubTable::Set>_>::
      emplace_back<llvm::DWARFDebugPubTable::Set>(&local_40->Sets,(Set *)local_80);
      if ((pointer)local_70.Length != (pointer)0x0) {
        operator_delete((void *)local_70.Length,(long)local_58 - local_70.Length);
      }
      pSVar2 = (local_40->Sets).
               super__Vector_base<llvm::DWARFDebugPubTable::Set,_std::allocator<llvm::DWARFDebugPubTable::Set>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      uVar5 = DataExtractor::getU32((DataExtractor *)local_b0,(uint64_t *)&local_38,(Error *)0x0);
      pSVar2[-1].Length = uVar5;
      uVar4 = DataExtractor::getU16((DataExtractor *)local_b0,(uint64_t *)&local_38,(Error *)0x0);
      pSVar2[-1].Version = uVar4;
      uVar6 = DWARFDataExtractor::getRelocatedValue
                        ((DWARFDataExtractor *)local_b0,4,(uint64_t *)&local_38,(uint64_t *)0x0,
                         (Error *)0x0);
      pSVar2[-1].Offset = uVar6;
      uVar5 = DataExtractor::getU32((DataExtractor *)local_b0,(uint64_t *)&local_38,(Error *)0x0);
      pSVar2[-1].Size = uVar5;
      if (local_38 < (char *)(local_50->Data).Length) {
        PubNames.Section = (DWARFSection *)&pSVar2[-1].Entries;
        do {
          uVar5 = DataExtractor::getU32
                            ((DataExtractor *)local_b0,(uint64_t *)&local_38,(Error *)0x0);
          if (uVar5 == 0) break;
          if ((char)local_44 == '\0') {
            uVar7 = 0;
          }
          else {
            bVar3 = DataExtractor::getU8
                              ((DataExtractor *)local_b0,(uint64_t *)&local_38,(Error *)0x0);
            uVar7 = (ulong)bVar3;
          }
          local_70 = DataExtractor::getCStrRef((DataExtractor *)local_b0,(uint64_t *)&local_38);
          local_80._0_8_ = ZEXT48(uVar5);
          local_80._8_8_ = CONCAT44((uint)uVar7 >> 7,(int)(uVar7 >> 4)) & 0xffffffff00000007;
          __position._M_current =
               pSVar2[-1].Entries.
               super__Vector_base<llvm::DWARFDebugPubTable::Entry,_std::allocator<llvm::DWARFDebugPubTable::Entry>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              pSVar2[-1].Entries.
              super__Vector_base<llvm::DWARFDebugPubTable::Entry,_std::allocator<llvm::DWARFDebugPubTable::Entry>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<llvm::DWARFDebugPubTable::Entry,_std::allocator<llvm::DWARFDebugPubTable::Entry>_>
            ::_M_realloc_insert<llvm::DWARFDebugPubTable::Entry>
                      ((vector<llvm::DWARFDebugPubTable::Entry,_std::allocator<llvm::DWARFDebugPubTable::Entry>_>
                        *)PubNames.Section,__position,(Entry *)local_80);
          }
          else {
            ((__position._M_current)->Name).Data = local_70.Data;
            ((__position._M_current)->Name).Length = local_70.Length;
            (__position._M_current)->SecOffset = local_80._0_8_;
            ((__position._M_current)->Descriptor).Kind = local_80._8_4_;
            ((__position._M_current)->Descriptor).Linkage = local_80._12_4_;
            ppEVar1 = &pSVar2[-1].Entries.
                       super__Vector_base<llvm::DWARFDebugPubTable::Entry,_std::allocator<llvm::DWARFDebugPubTable::Entry>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            *ppEVar1 = *ppEVar1 + 1;
          }
        } while (local_38 < (char *)(local_50->Data).Length);
      }
    } while (local_38 < PubNames.super_DataExtractor.Data.Data);
  }
  return;
}

Assistant:

DWARFDebugPubTable::DWARFDebugPubTable(const DWARFObject &Obj,
                                       const DWARFSection &Sec,
                                       bool LittleEndian, bool GnuStyle)
    : GnuStyle(GnuStyle) {
  DWARFDataExtractor PubNames(Obj, Sec, LittleEndian, 0);
  uint64_t Offset = 0;
  while (PubNames.isValidOffset(Offset)) {
    Sets.push_back({});
    Set &SetData = Sets.back();

    SetData.Length = PubNames.getU32(&Offset);
    SetData.Version = PubNames.getU16(&Offset);
    SetData.Offset = PubNames.getRelocatedValue(4, &Offset);
    SetData.Size = PubNames.getU32(&Offset);

    while (Offset < Sec.Data.size()) {
      uint32_t DieRef = PubNames.getU32(&Offset);
      if (DieRef == 0)
        break;
      uint8_t IndexEntryValue = GnuStyle ? PubNames.getU8(&Offset) : 0;
      StringRef Name = PubNames.getCStrRef(&Offset);
      SetData.Entries.push_back(
          {DieRef, PubIndexEntryDescriptor(IndexEntryValue), Name});
    }
  }
}